

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

wstring * __thiscall
fmt::v5::vformat_abi_cxx11_
          (wstring *__return_storage_ptr__,v5 *this,wstring_view format_str,wformat_args args)

{
  undefined **local_808;
  undefined1 *local_800;
  long local_7f8;
  undefined8 local_7f0;
  undefined1 local_7e8 [2000];
  
  local_7f8 = 0;
  local_808 = &PTR_grow_0014ecb0;
  local_7f0 = 500;
  local_800 = local_7e8;
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (&local_808,this,format_str.data_,format_str.size_);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)__return_storage_ptr__,local_800,local_800 + local_7f8 * 4);
  local_808 = &PTR_grow_0014ecb0;
  if (local_800 != local_7e8) {
    operator_delete(local_800);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::wstring vformat(wstring_view format_str, wformat_args args) {
  wmemory_buffer buffer;
  vformat_to(buffer, format_str, args);
  return to_string(buffer);
}